

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBucket::ReinsertLargeHeapBlock(LargeHeapBucket *this,LargeHeapBlock *heapBlock)

{
  LargeHeapBlock *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LargeHeapBlock **ppLVar5;
  
  if (heapBlock->hasPartialFreeObjects == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2b3,"(!heapBlock->hasPartialFreeObjects)",
                       "!heapBlock->hasPartialFreeObjects");
    if (!bVar3) goto LAB_006f9ac0;
    *puVar4 = 0;
  }
  if (heapBlock->isInPendingDisposeList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2b4,"(!heapBlock->IsInPendingDisposeList())",
                       "!heapBlock->IsInPendingDisposeList()");
    if (!bVar3) {
LAB_006f9ac0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pLVar1 = this->largeBlockList;
  if ((pLVar1 == (LargeHeapBlock *)0x0) ||
     ((ulong)((long)heapBlock->addressEnd - (long)heapBlock->allocAddressEnd) <=
      (ulong)((long)pLVar1->addressEnd - (long)pLVar1->allocAddressEnd))) {
    ppLVar5 = &this->fullLargeBlockList;
    heapBlock->next = this->fullLargeBlockList;
  }
  else {
    heapBlock->next = pLVar1->next;
    pLVar1->next = this->fullLargeBlockList;
    this->fullLargeBlockList = pLVar1;
    ppLVar5 = &this->largeBlockList;
  }
  *ppLVar5 = heapBlock;
  return;
}

Assistant:

void
LargeHeapBucket::ReinsertLargeHeapBlock(LargeHeapBlock * heapBlock)
{
    Assert(!heapBlock->hasPartialFreeObjects);
    Assert(!heapBlock->IsInPendingDisposeList());

    if (this->largeBlockList != nullptr && heapBlock->GetFreeSize() > this->largeBlockList->GetFreeSize())
    {
        heapBlock->SetNextBlock(this->largeBlockList->GetNextBlock());
        this->largeBlockList->SetNextBlock(this->fullLargeBlockList);
        this->fullLargeBlockList = this->largeBlockList;
        this->largeBlockList = heapBlock;
    }
    else
    {
        heapBlock->SetNextBlock(this->fullLargeBlockList);
        this->fullLargeBlockList = heapBlock;
    }
}